

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintStamp.cpp
# Opt level: O3

void __thiscall OpenMD::ConstraintStamp::validate(ConstraintStamp *this)

{
  double dVar1;
  pointer pcVar2;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  long local_30;
  long local_28 [2];
  
  DataHolder::validate(&this->super_DataHolder);
  if ((this->ConstrainedDistance).super_ParameterBase.empty_ == false) {
    isNonNegative();
    dVar1 = (this->ConstrainedDistance).data_;
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if (dVar1 < 0.0) {
      pcVar2 = (this->ConstrainedDistance).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,local_38,local_30 + (long)local_38);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      if (local_38 != local_28) {
        operator_delete(local_38,local_28[0] + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void ConstraintStamp::validate() {
    DataHolder::validate();
    CheckParameter(ConstrainedDistance, isNonNegative());
  }